

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O0

void MWT::save_load(mwt *c,io_buf *model_file,bool read,bool text)

{
  unsigned_long *puVar1;
  ulong *puVar2;
  size_t *psVar3;
  size_t sVar4;
  ostream *poVar5;
  unsigned_long **ppuVar6;
  policy_data *ppVar7;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  policy_data *pd;
  feature_index *policy_1;
  unsigned_long *__end1;
  unsigned_long *__begin1;
  v_array<unsigned_long> *__range1;
  feature_index *policy;
  unsigned_long *__end2;
  unsigned_long *__begin2;
  v_array<unsigned_long> *__range2;
  size_t policies_size;
  stringstream msg;
  size_t *local_1e8;
  ulong *local_1c8;
  stringstream local_1a0 [16];
  undefined1 local_190 [199];
  undefined1 in_stack_ffffffffffffff37;
  stringstream *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  char *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  io_buf *in_stack_ffffffffffffff60;
  
  sVar4 = v_array<int>::size((v_array<int> *)(in_RSI + 0x30));
  if (sVar4 != 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar5 = std::operator<<((ostream *)local_190,"total: ");
    std::ostream::operator<<(poVar5,*(double *)(in_RDI + 0x148));
    bin_text_read_write_fixed_validated
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47,in_stack_ffffffffffffff38,
               (bool)in_stack_ffffffffffffff37);
    sVar4 = v_array<unsigned_long>::size((v_array<unsigned_long> *)(in_RDI + 0x128));
    bin_text_read_write_fixed_validated
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47,in_stack_ffffffffffffff38,
               (bool)in_stack_ffffffffffffff37);
    if ((in_DL & 1) == 0) {
      std::operator<<((ostream *)local_190,"policies: ");
      ppuVar6 = v_array<unsigned_long>::begin((v_array<unsigned_long> *)(in_RDI + 0x128));
      local_1c8 = *ppuVar6;
      ppuVar6 = v_array<unsigned_long>::end((v_array<unsigned_long> *)(in_RDI + 0x128));
      puVar2 = *ppuVar6;
      for (; local_1c8 != puVar2; local_1c8 = local_1c8 + 1) {
        poVar5 = (ostream *)std::ostream::operator<<(local_190,*local_1c8);
        std::operator<<(poVar5," ");
      }
    }
    else {
      v_array<unsigned_long>::resize
                ((v_array<unsigned_long> *)
                 CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                 (size_t)in_stack_ffffffffffffff38);
      ppuVar6 = v_array<unsigned_long>::begin((v_array<unsigned_long> *)(in_RDI + 0x128));
      puVar1 = *ppuVar6;
      ppuVar6 = v_array<unsigned_long>::end((v_array<unsigned_long> *)(in_RDI + 0x128));
      *ppuVar6 = puVar1 + sVar4;
    }
    v_array<unsigned_long>::begin((v_array<unsigned_long> *)(in_RDI + 0x128));
    bin_text_read_write_fixed_validated
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47,in_stack_ffffffffffffff38,
               (bool)in_stack_ffffffffffffff37);
    ppuVar6 = v_array<unsigned_long>::begin((v_array<unsigned_long> *)(in_RDI + 0x128));
    local_1e8 = *ppuVar6;
    ppuVar6 = v_array<unsigned_long>::end((v_array<unsigned_long> *)(in_RDI + 0x128));
    psVar3 = *ppuVar6;
    for (; local_1e8 != psVar3; local_1e8 = local_1e8 + 1) {
      ppVar7 = v_array<MWT::policy_data>::operator[]
                         ((v_array<MWT::policy_data> *)(in_RDI + 0x100),*local_1e8);
      if ((in_DL & 1) != 0) {
        poVar5 = std::operator<<((ostream *)local_190,"evals: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_1e8);
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,ppVar7->action);
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,ppVar7->cost);
        std::operator<<(poVar5," ");
      }
      v_array<MWT::policy_data>::operator[]
                ((v_array<MWT::policy_data> *)(in_RDI + 0x100),*local_1e8);
      bin_text_read_write_fixed_validated
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47,in_stack_ffffffffffffff38
                 ,(bool)in_stack_ffffffffffffff37);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

void save_load(mwt& c, io_buf& model_file, bool read, bool text)
{
  if (model_file.files.size() == 0)
    return;

  stringstream msg;

  // total
  msg << "total: " << c.total;
  bin_text_read_write_fixed_validated(model_file, (char*)&c.total, sizeof(c.total), "", read, msg, text);

  // policies
  size_t policies_size = c.policies.size();
  bin_text_read_write_fixed_validated(model_file, (char*)&policies_size, sizeof(policies_size), "", read, msg, text);

  if (read)
  {
    c.policies.resize(policies_size);
    c.policies.end() = c.policies.begin() + policies_size;
  }
  else
  {
    msg << "policies: ";
    for (feature_index& policy : c.policies) msg << policy << " ";
  }

  bin_text_read_write_fixed_validated(
      model_file, (char*)c.policies.begin(), policies_size * sizeof(feature_index), "", read, msg, text);

  // c.evals is already initialized nicely to the same size as the regressor.
  for (feature_index& policy : c.policies)
  {
    policy_data& pd = c.evals[policy];
    if (read)
      msg << "evals: " << policy << ":" << pd.action << ":" << pd.cost << " ";
    bin_text_read_write_fixed_validated(model_file, (char*)&c.evals[policy], sizeof(policy_data), "", read, msg, text);
  }
}